

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O3

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  pointer pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  size_type local_20;
  pointer local_18;
  undefined8 local_10;
  
  local_20 = globalGenerator->_M_string_length;
  if (local_20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_50.first._M_len = extraGenerator->_M_string_length;
    if (local_50.first._M_len == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (globalGenerator->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + local_20);
    }
    else {
      local_50.first._M_str = (extraGenerator->_M_dataplus)._M_p;
      local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_38 = 3;
      local_30 = " - ";
      local_28 = 0;
      local_18 = (globalGenerator->_M_dataplus)._M_p;
      local_10 = 0;
      views._M_len = 3;
      views._M_array = &local_50;
      cmCatViews(__return_storage_ptr__,views);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  if (globalGenerator.empty()) {
    return {};
  }
  if (extraGenerator.empty()) {
    return globalGenerator;
  }
  return cmStrCat(extraGenerator, " - ", globalGenerator);
}